

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QPDFObject.cc
# Opt level: O3

string * __thiscall
QPDFObject::getDescription_abi_cxx11_(string *__return_storage_ptr__,QPDFObject *this)

{
  _Atomic_word *p_Var1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  int iVar3;
  __index_type _Var4;
  variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_QPDFObject::JSON_Descr,_QPDFObject::ChildDescr,_QPDFObject::ObjStreamDescr>
  *__v;
  pointer pcVar5;
  long lVar6;
  int iVar7;
  variant_alternative_t<0UL,_variant<basic_string<char>,_JSON_Descr,_ChildDescr,_ObjStreamDescr>_>
  *pvVar8;
  long *plVar9;
  variant_alternative_t<2UL,_variant<basic_string<char>,_JSON_Descr,_ChildDescr,_ObjStreamDescr>_>
  *pvVar10;
  variant_alternative_t<3UL,_variant<basic_string<char>,_JSON_Descr,_ChildDescr,_ObjStreamDescr>_>
  *pvVar11;
  variant_alternative_t<1UL,_variant<basic_string<char>,_JSON_Descr,_ChildDescr,_ObjStreamDescr>_>
  *pvVar12;
  undefined8 *puVar13;
  uint uVar14;
  uint uVar15;
  ulong uVar16;
  size_type *psVar17;
  long *plVar18;
  ulong *puVar19;
  ulong uVar20;
  ulong uVar21;
  uint uVar22;
  uint uVar23;
  uint uVar24;
  undefined8 uVar25;
  pointer *ppcVar26;
  ulong uVar27;
  bool bVar28;
  variant_alternative_t<2UL,_variant<basic_string<char>,_JSON_Descr,_ChildDescr,_ObjStreamDescr>_>
  j_descr;
  string __str;
  undefined1 local_158 [16];
  undefined1 local_148 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_138;
  string local_120;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_100;
  long *local_e0;
  long local_d8;
  long local_d0;
  long lStack_c8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_c0;
  ulong *local_b8;
  long local_b0;
  ulong local_a8;
  long lStack_a0;
  string *local_98;
  ulong *local_90;
  long local_88;
  ulong local_80 [2];
  ulong *local_70;
  long local_68;
  ulong local_60 [2];
  pointer *local_50 [2];
  pointer local_40 [2];
  
  _Var4 = (this->value).
          super__Variant_base<std::monostate,_QPDF_Reserved,_QPDF_Null,_QPDF_Bool,_QPDF_Integer,_QPDF_Real,_QPDF_String,_QPDF_Name,_QPDF_Array,_QPDF_Dictionary,_QPDF_Stream,_QPDF_Operator,_QPDF_InlineImage,_QPDF_Unresolved,_QPDF_Destroyed,_QPDF_Reference>
          .
          super__Move_assign_alias<std::monostate,_QPDF_Reserved,_QPDF_Null,_QPDF_Bool,_QPDF_Integer,_QPDF_Real,_QPDF_String,_QPDF_Name,_QPDF_Array,_QPDF_Dictionary,_QPDF_Stream,_QPDF_Operator,_QPDF_InlineImage,_QPDF_Unresolved,_QPDF_Destroyed,_QPDF_Reference>
          .
          super__Copy_assign_alias<std::monostate,_QPDF_Reserved,_QPDF_Null,_QPDF_Bool,_QPDF_Integer,_QPDF_Real,_QPDF_String,_QPDF_Name,_QPDF_Array,_QPDF_Dictionary,_QPDF_Stream,_QPDF_Operator,_QPDF_InlineImage,_QPDF_Unresolved,_QPDF_Destroyed,_QPDF_Reference>
          .
          super__Move_ctor_alias<std::monostate,_QPDF_Reserved,_QPDF_Null,_QPDF_Bool,_QPDF_Integer,_QPDF_Real,_QPDF_String,_QPDF_Name,_QPDF_Array,_QPDF_Dictionary,_QPDF_Stream,_QPDF_Operator,_QPDF_InlineImage,_QPDF_Unresolved,_QPDF_Destroyed,_QPDF_Reference>
          .
          super__Copy_ctor_alias<std::monostate,_QPDF_Reserved,_QPDF_Null,_QPDF_Bool,_QPDF_Integer,_QPDF_Real,_QPDF_String,_QPDF_Name,_QPDF_Array,_QPDF_Dictionary,_QPDF_Stream,_QPDF_Operator,_QPDF_InlineImage,_QPDF_Unresolved,_QPDF_Destroyed,_QPDF_Reference>
          .
          super__Variant_storage_alias<std::monostate,_QPDF_Reserved,_QPDF_Null,_QPDF_Bool,_QPDF_Integer,_QPDF_Real,_QPDF_String,_QPDF_Name,_QPDF_Array,_QPDF_Dictionary,_QPDF_Stream,_QPDF_Operator,_QPDF_InlineImage,_QPDF_Unresolved,_QPDF_Destroyed,_QPDF_Reference>
          ._M_index;
  uVar27 = 2;
  if (_Var4 != '\t') {
    uVar27 = (ulong)(_Var4 == '\b');
  }
  __v = (this->object_description).
        super___shared_ptr<std::variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_QPDFObject::JSON_Descr,_QPDFObject::ChildDescr,_QPDFObject::ObjStreamDescr>,_(__gnu_cxx::_Lock_policy)2>
        ._M_ptr;
  if (__v == (variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_QPDFObject::JSON_Descr,_QPDFObject::ChildDescr,_QPDFObject::ObjStreamDescr>
              *)0x0) {
    if ((this->og).obj == 0) goto switchD_001bee3e_default;
    QPDFObjGen::unparse_abi_cxx11_((string *)local_158,&this->og,' ');
    plVar9 = (long *)std::__cxx11::string::replace((ulong)local_158,0,(char *)0x0,0x27961a);
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    psVar17 = (size_type *)(plVar9 + 2);
    if ((size_type *)*plVar9 == psVar17) {
      lVar6 = plVar9[3];
      (__return_storage_ptr__->field_2)._M_allocated_capacity = *psVar17;
      *(long *)((long)&__return_storage_ptr__->field_2 + 8) = lVar6;
    }
    else {
      (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)*plVar9;
      (__return_storage_ptr__->field_2)._M_allocated_capacity = *psVar17;
    }
    __return_storage_ptr__->_M_string_length = plVar9[1];
    *plVar9 = (long)psVar17;
    plVar9[1] = 0;
    *(undefined1 *)(plVar9 + 2) = 0;
    local_40[0] = (pointer)local_148._0_8_;
    ppcVar26 = (pointer *)local_158._0_8_;
    if ((undefined1 *)local_158._0_8_ == local_158 + 0x10) {
      return __return_storage_ptr__;
    }
LAB_001bfad3:
    operator_delete(ppcVar26,(ulong)(local_40[0] + 1));
  }
  else {
    switch((__v->
           super__Variant_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_QPDFObject::JSON_Descr,_QPDFObject::ChildDescr,_QPDFObject::ObjStreamDescr>
           ).
           super__Move_assign_alias<std::__cxx11::basic_string<char>,_QPDFObject::JSON_Descr,_QPDFObject::ChildDescr,_QPDFObject::ObjStreamDescr>
           .
           super__Copy_assign_alias<std::__cxx11::basic_string<char>,_QPDFObject::JSON_Descr,_QPDFObject::ChildDescr,_QPDFObject::ObjStreamDescr>
           .
           super__Move_ctor_alias<std::__cxx11::basic_string<char>,_QPDFObject::JSON_Descr,_QPDFObject::ChildDescr,_QPDFObject::ObjStreamDescr>
           .
           super__Copy_ctor_alias<std::__cxx11::basic_string<char>,_QPDFObject::JSON_Descr,_QPDFObject::ChildDescr,_QPDFObject::ObjStreamDescr>
           .
           super__Variant_storage_alias<std::__cxx11::basic_string<char>,_QPDFObject::JSON_Descr,_QPDFObject::ChildDescr,_QPDFObject::ObjStreamDescr>
           ._M_index) {
    case '\0':
      pvVar8 = std::
               get<0ul,std::__cxx11::string,QPDFObject::JSON_Descr,QPDFObject::ChildDescr,QPDFObject::ObjStreamDescr>
                         (__v);
      local_c0 = &__return_storage_ptr__->field_2;
      (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)local_c0;
      pcVar5 = (pvVar8->_M_dataplus)._M_p;
      std::__cxx11::string::_M_construct<char*>
                ((string *)__return_storage_ptr__,pcVar5,pcVar5 + pvVar8->_M_string_length);
      uVar21 = std::__cxx11::string::find((char *)__return_storage_ptr__,0x279614,0);
      if (uVar21 != 0xffffffffffffffff) {
        QPDFObjGen::unparse_abi_cxx11_((string *)local_158,&this->og,' ');
        std::__cxx11::string::replace
                  ((ulong)__return_storage_ptr__,uVar21,(char *)0x3,local_158._0_8_);
        if ((undefined1 *)local_158._0_8_ != local_158 + 0x10) {
          operator_delete((void *)local_158._0_8_,(ulong)(local_148._0_8_ + 1));
        }
      }
      uVar21 = std::__cxx11::string::find((char *)__return_storage_ptr__,0x27a297,0);
      if (uVar21 != 0xffffffffffffffff) {
        uVar27 = uVar27 + this->parsed_offset;
        uVar20 = -uVar27;
        if (0 < (long)uVar27) {
          uVar20 = uVar27;
        }
        uVar24 = 1;
        if (9 < uVar20) {
          uVar16 = uVar20;
          uVar23 = 4;
          do {
            uVar24 = uVar23;
            if (uVar16 < 100) {
              uVar24 = uVar24 - 2;
              goto LAB_001bfae4;
            }
            if (uVar16 < 1000) {
              uVar24 = uVar24 - 1;
              goto LAB_001bfae4;
            }
            if (uVar16 < 10000) goto LAB_001bfae4;
            bVar28 = 99999 < uVar16;
            uVar16 = uVar16 / 10000;
            uVar23 = uVar24 + 4;
          } while (bVar28);
          uVar24 = uVar24 + 1;
        }
LAB_001bfae4:
        local_158._0_8_ = local_158 + 0x10;
        std::__cxx11::string::_M_construct
                  ((ulong)local_158,(char)uVar24 - (char)((long)uVar27 >> 0x3f));
        std::__detail::__to_chars_10_impl<unsigned_long_long>
                  ((char *)(local_158._0_8_ + -((long)uVar27 >> 0x3f)),uVar24,uVar20);
        std::__cxx11::string::replace
                  ((ulong)__return_storage_ptr__,uVar21,(char *)0x3,local_158._0_8_);
        if ((undefined1 *)local_158._0_8_ != local_158 + 0x10) {
          operator_delete((void *)local_158._0_8_,(ulong)(local_148._0_8_ + 1));
        }
      }
      break;
    case '\x01':
      pvVar12 = std::
                get<1ul,std::__cxx11::string,QPDFObject::JSON_Descr,QPDFObject::ChildDescr,QPDFObject::ObjStreamDescr>
                          (__v);
      local_158._0_8_ =
           (pvVar12->input).
           super___shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
           ._M_ptr;
      local_158._8_8_ =
           (pvVar12->input).
           super___shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
           ._M_refcount._M_pi;
      if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_158._8_8_ !=
          (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        if (__libc_single_threaded == '\0') {
          LOCK();
          ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_158._8_8_)->_M_use_count =
               ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_158._8_8_)->_M_use_count + 1;
          UNLOCK();
        }
        else {
          ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_158._8_8_)->_M_use_count =
               ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_158._8_8_)->_M_use_count + 1;
        }
      }
      local_148._0_8_ = &local_138;
      pcVar5 = (pvVar12->object)._M_dataplus._M_p;
      std::__cxx11::string::_M_construct<char*>
                ((string *)(local_158 + 0x10),pcVar5,pcVar5 + (pvVar12->object)._M_string_length);
      uVar25 = local_158._0_8_;
      if (local_148._8_8_ == 0) {
        local_100._M_dataplus._M_p = (pointer)&local_100.field_2;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_100);
      }
      else {
        std::operator+(&local_100,", ",
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       (local_158 + 0x10));
      }
      plVar9 = (long *)std::__cxx11::string::replace
                                 ((ulong)&local_100,0,(char *)0x0,*(ulong *)uVar25);
      local_e0 = &local_d0;
      plVar18 = plVar9 + 2;
      if ((long *)*plVar9 == plVar18) {
        local_d0 = *plVar18;
        lStack_c8 = plVar9[3];
      }
      else {
        local_d0 = *plVar18;
        local_e0 = (long *)*plVar9;
      }
      local_d8 = plVar9[1];
      *plVar9 = (long)plVar18;
      plVar9[1] = 0;
      *(undefined1 *)(plVar9 + 2) = 0;
      plVar9 = (long *)std::__cxx11::string::append((char *)&local_e0);
      paVar2 = &local_120.field_2;
      puVar19 = (ulong *)(plVar9 + 2);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*plVar9 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)puVar19) {
        local_120.field_2._M_allocated_capacity = *puVar19;
        local_120.field_2._8_8_ = plVar9[3];
        local_120._M_dataplus._M_p = (pointer)paVar2;
      }
      else {
        local_120.field_2._M_allocated_capacity = *puVar19;
        local_120._M_dataplus._M_p = (pointer)*plVar9;
      }
      local_120._M_string_length = plVar9[1];
      *plVar9 = (long)puVar19;
      plVar9[1] = 0;
      *(undefined1 *)(plVar9 + 2) = 0;
      uVar27 = this->parsed_offset;
      uVar21 = -uVar27;
      if (0 < (long)uVar27) {
        uVar21 = uVar27;
      }
      uVar24 = 1;
      if (9 < uVar21) {
        uVar20 = uVar21;
        uVar23 = 4;
        do {
          uVar24 = uVar23;
          if (uVar20 < 100) {
            uVar24 = uVar24 - 2;
            goto LAB_001bf751;
          }
          if (uVar20 < 1000) {
            uVar24 = uVar24 - 1;
            goto LAB_001bf751;
          }
          if (uVar20 < 10000) goto LAB_001bf751;
          bVar28 = 99999 < uVar20;
          uVar20 = uVar20 / 10000;
          uVar23 = uVar24 + 4;
        } while (bVar28);
        uVar24 = uVar24 + 1;
      }
LAB_001bf751:
      local_b8 = &local_a8;
      std::__cxx11::string::_M_construct
                ((ulong)&local_b8,(char)uVar24 - (char)((long)uVar27 >> 0x3f));
      std::__detail::__to_chars_10_impl<unsigned_long_long>
                ((char *)((long)local_b8 - ((long)uVar27 >> 0x3f)),uVar24,uVar21);
      uVar25 = 0xf;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_120._M_dataplus._M_p != paVar2) {
        uVar25 = local_120.field_2._M_allocated_capacity;
      }
      if ((ulong)uVar25 < local_b0 + local_120._M_string_length) {
        uVar27 = 0xf;
        if (local_b8 != &local_a8) {
          uVar27 = local_a8;
        }
        if (uVar27 < local_b0 + local_120._M_string_length) goto LAB_001bf7d6;
        puVar13 = (undefined8 *)
                  std::__cxx11::string::replace
                            ((ulong)&local_b8,0,(char *)0x0,(ulong)local_120._M_dataplus._M_p);
      }
      else {
LAB_001bf7d6:
        puVar13 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_120,(ulong)local_b8);
      }
      (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
      psVar17 = puVar13 + 2;
      if ((size_type *)*puVar13 == psVar17) {
        uVar25 = puVar13[3];
        (__return_storage_ptr__->field_2)._M_allocated_capacity = *psVar17;
        *(undefined8 *)((long)&__return_storage_ptr__->field_2 + 8) = uVar25;
      }
      else {
        (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)*puVar13;
        (__return_storage_ptr__->field_2)._M_allocated_capacity = *psVar17;
      }
      __return_storage_ptr__->_M_string_length = puVar13[1];
      *puVar13 = psVar17;
      puVar13[1] = 0;
      *(undefined1 *)psVar17 = 0;
      if (local_b8 != &local_a8) {
        operator_delete(local_b8,local_a8 + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_120._M_dataplus._M_p != paVar2) {
        operator_delete(local_120._M_dataplus._M_p,local_120.field_2._M_allocated_capacity + 1);
      }
      if (local_e0 != &local_d0) {
        operator_delete(local_e0,local_d0 + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_100._M_dataplus._M_p != &local_100.field_2) {
        operator_delete(local_100._M_dataplus._M_p,local_100.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_148._0_8_ != &local_138) {
        operator_delete((void *)local_148._0_8_,local_138._M_allocated_capacity + 1);
      }
      if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_158._8_8_ !=
          (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_158._8_8_);
      }
      break;
    case '\x02':
      pvVar10 = std::
                get<2ul,std::__cxx11::string,QPDFObject::JSON_Descr,QPDFObject::ChildDescr,QPDFObject::ObjStreamDescr>
                          (__v);
      local_158._0_8_ =
           (pvVar10->parent).super___weak_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
      local_158._8_8_ =
           (pvVar10->parent).super___weak_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
           _M_pi;
      if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_158._8_8_ !=
          (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        if (__libc_single_threaded == '\0') {
          LOCK();
          ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_158._8_8_)->_M_weak_count =
               ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_158._8_8_)->_M_weak_count + 1;
          UNLOCK();
        }
        else {
          ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_158._8_8_)->_M_weak_count =
               ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_158._8_8_)->_M_weak_count + 1;
        }
      }
      local_148._0_8_ = pvVar10->static_descr;
      pcVar5 = (pvVar10->var_descr)._M_dataplus._M_p;
      local_148._8_8_ = local_138._M_local_buf + 8;
      std::__cxx11::string::_M_construct<char*>
                ((string *)(local_148 + 8),pcVar5,pcVar5 + (pvVar10->var_descr)._M_string_length);
      uVar25 = local_158._8_8_;
      (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
      __return_storage_ptr__->_M_string_length = 0;
      (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
      if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_158._8_8_ !=
          (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        iVar7 = *(_Atomic_word *)(local_158._8_8_ + 8);
        do {
          if (iVar7 == 0) goto LAB_001bf1df;
          LOCK();
          iVar3 = *(_Atomic_word *)(local_158._8_8_ + 8);
          bVar28 = iVar7 == iVar3;
          if (bVar28) {
            *(_Atomic_word *)(local_158._8_8_ + 8) = iVar7 + 1;
            iVar3 = iVar7;
          }
          iVar7 = iVar3;
          UNLOCK();
        } while (!bVar28);
        if ((QPDFObject *)local_158._0_8_ != (QPDFObject *)0x0 &&
            *(_Atomic_word *)(local_158._8_8_ + 8) != 0) {
          getDescription_abi_cxx11_(&local_120,(QPDFObject *)local_158._0_8_);
          std::__cxx11::string::operator=((string *)__return_storage_ptr__,(string *)&local_120);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_120._M_dataplus._M_p != &local_120.field_2) {
            operator_delete(local_120._M_dataplus._M_p,local_120.field_2._M_allocated_capacity + 1);
          }
        }
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)uVar25);
      }
LAB_001bf1df:
      std::__cxx11::string::append
                ((char *)__return_storage_ptr__,(ulong)*(char **)(local_148._0_8_ + 8));
      uVar27 = std::__cxx11::string::find((char *)__return_storage_ptr__,0x27c66f,0);
      if (uVar27 != 0xffffffffffffffff) {
        std::__cxx11::string::replace
                  ((ulong)__return_storage_ptr__,uVar27,(char *)0x3,local_148._8_8_);
      }
      if ((char *)local_148._8_8_ != local_138._M_local_buf + 8) {
        operator_delete((void *)local_148._8_8_,local_138._8_8_ + 1);
      }
      if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_158._8_8_ !=
          (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        if (__libc_single_threaded == '\0') {
          LOCK();
          p_Var1 = (_Atomic_word *)(local_158._8_8_ + 0xc);
          iVar7 = *p_Var1;
          *p_Var1 = *p_Var1 + -1;
          UNLOCK();
        }
        else {
          iVar7 = *(_Atomic_word *)(local_158._8_8_ + 0xc);
          *(int *)(local_158._8_8_ + 0xc) = iVar7 + -1;
        }
        if (iVar7 == 1) {
          (*(*(_func_int ***)local_158._8_8_)[3])();
        }
      }
      break;
    case '\x03':
      pvVar11 = std::
                get<3ul,std::__cxx11::string,QPDFObject::JSON_Descr,QPDFObject::ChildDescr,QPDFObject::ObjStreamDescr>
                          (__v);
      uVar24 = pvVar11->stream_id;
      local_c0 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                  *)(ulong)(uint)pvVar11->obj_id;
      local_98 = __return_storage_ptr__;
      if (this->qpdf == (QPDF *)0x0) {
        (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
        std::__cxx11::string::_M_construct<char_const*>((string *)__return_storage_ptr__,"");
      }
      else {
        QPDF::getFilename_abi_cxx11_(__return_storage_ptr__,this->qpdf);
      }
      uVar23 = -uVar24;
      if (0 < (int)uVar24) {
        uVar23 = uVar24;
      }
      uVar22 = 1;
      if (9 < uVar23) {
        uVar21 = (ulong)uVar23;
        uVar15 = 4;
        do {
          uVar22 = uVar15;
          uVar14 = (uint)uVar21;
          if (uVar14 < 100) {
            uVar22 = uVar22 - 2;
            goto LAB_001bf424;
          }
          if (uVar14 < 1000) {
            uVar22 = uVar22 - 1;
            goto LAB_001bf424;
          }
          if (uVar14 < 10000) goto LAB_001bf424;
          uVar21 = uVar21 / 10000;
          uVar15 = uVar22 + 4;
        } while (99999 < uVar14);
        uVar22 = uVar22 + 1;
      }
LAB_001bf424:
      local_50[0] = local_40;
      std::__cxx11::string::_M_construct((ulong)local_50,(char)uVar22 - (char)((int)uVar24 >> 0x1f))
      ;
      std::__detail::__to_chars_10_impl<unsigned_int>
                ((char *)((ulong)(uVar24 >> 0x1f) + (long)local_50[0]),uVar22,uVar23);
      plVar9 = (long *)std::__cxx11::string::replace((ulong)local_50,0,(char *)0x0,0x28017d);
      paVar2 = local_c0;
      puVar19 = (ulong *)(plVar9 + 2);
      if ((ulong *)*plVar9 == puVar19) {
        local_a8 = *puVar19;
        lStack_a0 = plVar9[3];
        local_b8 = &local_a8;
      }
      else {
        local_a8 = *puVar19;
        local_b8 = (ulong *)*plVar9;
      }
      local_b0 = plVar9[1];
      *plVar9 = (long)puVar19;
      plVar9[1] = 0;
      *(undefined1 *)(plVar9 + 2) = 0;
      plVar9 = (long *)std::__cxx11::string::append((char *)&local_b8);
      local_100._M_dataplus._M_p = (pointer)&local_100.field_2;
      puVar19 = (ulong *)(plVar9 + 2);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*plVar9 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)puVar19) {
        local_100.field_2._M_allocated_capacity = *puVar19;
        local_100.field_2._8_8_ = plVar9[3];
      }
      else {
        local_100.field_2._M_allocated_capacity = *puVar19;
        local_100._M_dataplus._M_p = (pointer)*plVar9;
      }
      local_100._M_string_length = plVar9[1];
      *plVar9 = (long)puVar19;
      plVar9[1] = 0;
      *(undefined1 *)(plVar9 + 2) = 0;
      uVar23 = (uint)paVar2;
      uVar24 = -uVar23;
      if (0 < (int)uVar23) {
        uVar24 = uVar23;
      }
      uVar23 = 1;
      if (9 < uVar24) {
        uVar21 = (ulong)uVar24;
        uVar22 = 4;
        do {
          uVar23 = uVar22;
          uVar15 = (uint)uVar21;
          if (uVar15 < 100) {
            uVar23 = uVar23 - 2;
            goto LAB_001bf583;
          }
          if (uVar15 < 1000) {
            uVar23 = uVar23 - 1;
            goto LAB_001bf583;
          }
          if (uVar15 < 10000) goto LAB_001bf583;
          uVar21 = uVar21 / 10000;
          uVar22 = uVar23 + 4;
        } while (99999 < uVar15);
        uVar23 = uVar23 + 1;
      }
LAB_001bf583:
      uVar21 = (ulong)paVar2 >> 0x1f & 1;
      local_90 = local_80;
      std::__cxx11::string::_M_construct((ulong)&local_90,(char)uVar23 + (char)uVar21);
      std::__detail::__to_chars_10_impl<unsigned_int>
                ((char *)(uVar21 + (long)local_90),uVar23,uVar24);
      uVar25 = 0xf;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_100._M_dataplus._M_p != &local_100.field_2) {
        uVar25 = local_100.field_2._M_allocated_capacity;
      }
      if ((ulong)uVar25 < local_88 + local_100._M_string_length) {
        uVar21 = 0xf;
        if (local_90 != local_80) {
          uVar21 = local_80[0];
        }
        if (uVar21 < local_88 + local_100._M_string_length) goto LAB_001bf613;
        puVar13 = (undefined8 *)
                  std::__cxx11::string::replace
                            ((ulong)&local_90,0,(char *)0x0,(ulong)local_100._M_dataplus._M_p);
      }
      else {
LAB_001bf613:
        puVar13 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_100,(ulong)local_90);
      }
      local_e0 = &local_d0;
      plVar9 = puVar13 + 2;
      if ((long *)*puVar13 == plVar9) {
        local_d0 = *plVar9;
        lStack_c8 = puVar13[3];
      }
      else {
        local_d0 = *plVar9;
        local_e0 = (long *)*puVar13;
      }
      local_d8 = puVar13[1];
      *puVar13 = plVar9;
      puVar13[1] = 0;
      *(undefined1 *)plVar9 = 0;
      plVar9 = (long *)std::__cxx11::string::append((char *)&local_e0);
      paVar2 = &local_120.field_2;
      puVar19 = (ulong *)(plVar9 + 2);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*plVar9 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)puVar19) {
        local_120.field_2._M_allocated_capacity = *puVar19;
        local_120.field_2._8_8_ = plVar9[3];
        local_120._M_dataplus._M_p = (pointer)paVar2;
      }
      else {
        local_120.field_2._M_allocated_capacity = *puVar19;
        local_120._M_dataplus._M_p = (pointer)*plVar9;
      }
      local_120._M_string_length = plVar9[1];
      *plVar9 = (long)puVar19;
      plVar9[1] = 0;
      *(undefined1 *)(plVar9 + 2) = 0;
      uVar27 = uVar27 + this->parsed_offset;
      uVar21 = -uVar27;
      if (0 < (long)uVar27) {
        uVar21 = uVar27;
      }
      uVar24 = 1;
      if (9 < uVar21) {
        uVar20 = uVar21;
        uVar23 = 4;
        do {
          uVar24 = uVar23;
          if (uVar20 < 100) {
            uVar24 = uVar24 - 2;
            goto LAB_001bf8df;
          }
          if (uVar20 < 1000) {
            uVar24 = uVar24 - 1;
            goto LAB_001bf8df;
          }
          if (uVar20 < 10000) goto LAB_001bf8df;
          bVar28 = 99999 < uVar20;
          uVar20 = uVar20 / 10000;
          uVar23 = uVar24 + 4;
        } while (bVar28);
        uVar24 = uVar24 + 1;
      }
LAB_001bf8df:
      local_70 = local_60;
      std::__cxx11::string::_M_construct
                ((ulong)&local_70,(char)uVar24 - (char)((long)uVar27 >> 0x3f));
      std::__detail::__to_chars_10_impl<unsigned_long_long>
                ((char *)((long)local_70 - ((long)uVar27 >> 0x3f)),uVar24,uVar21);
      uVar25 = 0xf;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_120._M_dataplus._M_p != paVar2) {
        uVar25 = local_120.field_2._M_allocated_capacity;
      }
      if ((ulong)uVar25 < local_68 + local_120._M_string_length) {
        uVar27 = 0xf;
        if (local_70 != local_60) {
          uVar27 = local_60[0];
        }
        if (uVar27 < local_68 + local_120._M_string_length) goto LAB_001bf967;
        puVar13 = (undefined8 *)
                  std::__cxx11::string::replace
                            ((ulong)&local_70,0,(char *)0x0,(ulong)local_120._M_dataplus._M_p);
      }
      else {
LAB_001bf967:
        puVar13 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_120,(ulong)local_70);
      }
      local_158._0_8_ = local_158 + 0x10;
      ppcVar26 = (pointer *)(puVar13 + 2);
      if ((pointer *)*puVar13 == ppcVar26) {
        local_148._0_8_ = *ppcVar26;
        local_148._8_8_ = puVar13[3];
      }
      else {
        local_148._0_8_ = *ppcVar26;
        local_158._0_8_ = (pointer *)*puVar13;
      }
      local_158._8_8_ = puVar13[1];
      *puVar13 = ppcVar26;
      puVar13[1] = 0;
      *(undefined1 *)ppcVar26 = 0;
      std::__cxx11::string::_M_append((char *)local_98,local_158._0_8_);
      if ((undefined1 *)local_158._0_8_ != local_158 + 0x10) {
        operator_delete((void *)local_158._0_8_,(ulong)(local_148._0_8_ + 1));
      }
      if (local_70 != local_60) {
        operator_delete(local_70,local_60[0] + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_120._M_dataplus._M_p != paVar2) {
        operator_delete(local_120._M_dataplus._M_p,local_120.field_2._M_allocated_capacity + 1);
      }
      __return_storage_ptr__ = local_98;
      if (local_e0 != &local_d0) {
        operator_delete(local_e0,local_d0 + 1);
      }
      if (local_90 != local_80) {
        operator_delete(local_90,local_80[0] + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_100._M_dataplus._M_p != &local_100.field_2) {
        operator_delete(local_100._M_dataplus._M_p,local_100.field_2._M_allocated_capacity + 1);
      }
      if (local_b8 != &local_a8) {
        operator_delete(local_b8,local_a8 + 1);
      }
      ppcVar26 = local_50[0];
      if (local_50[0] == local_40) {
        return __return_storage_ptr__;
      }
      goto LAB_001bfad3;
    default:
switchD_001bee3e_default:
      (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
      __return_storage_ptr__->_M_string_length = 0;
      (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
    }
  }
  return __return_storage_ptr__;
}

Assistant:

std::string
QPDFObject::getDescription()
{
    qpdf_offset_t shift = (getTypeCode() == ::ot_dictionary) ? 2
        : (getTypeCode() == ::ot_array)                      ? 1
                                                             : 0;

    if (object_description) {
        switch (object_description->index()) {
        case 0:
            {
                // Simple template string
                auto description = std::get<0>(*object_description);

                if (auto pos = description.find("$OG"); pos != std::string::npos) {
                    description.replace(pos, 3, og.unparse(' '));
                }
                if (auto pos = description.find("$PO"); pos != std::string::npos) {
                    description.replace(pos, 3, std::to_string(parsed_offset + shift));
                }
                return description;
            }
        case 1:
            {
                // QPDF::JSONReactor generated description
                auto j_descr = std::get<1>(*object_description);
                return (
                    *j_descr.input + (j_descr.object.empty() ? "" : ", " + j_descr.object) +
                    " at offset " + std::to_string(parsed_offset));
            }
        case 2:
            {
                // Child object description
                auto j_descr = std::get<2>(*object_description);
                std::string result;
                if (auto p = j_descr.parent.lock()) {
                    result = p->getDescription();
                }
                result += j_descr.static_descr;
                if (auto pos = result.find("$VD"); pos != std::string::npos) {
                    result.replace(pos, 3, j_descr.var_descr);
                }
                return result;
            }
        case 3:
            auto [stream_id, obj_id] = std::get<3>(*object_description);
            std::string result = qpdf ? qpdf->getFilename() : "";
            result += " object stream " + std::to_string(stream_id) + ", object " +
                std::to_string(obj_id) + " 0 at offset " + std::to_string(parsed_offset + shift);
            return result;
        }

    } else if (og.isIndirect()) {
        return "object " + og.unparse(' ');
    }
    return {};
}